

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleAliases.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  ArrayIterator *pAVar2;
  size_t i;
  uint8_t *puVar3;
  VPackSlice s;
  ArrayIterator __begin1;
  VPackBuilder b;
  Slice local_138;
  ArrayIterator local_130;
  uint8_t *local_110;
  ArrayIterator local_108;
  Builder local_e0;
  
  arangodb::velocypack::Builder::Builder(&local_e0);
  arangodb::velocypack::Value::Value((Value *)&local_130,Array,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e0,(Value *)&local_130);
  puVar3 = (uint8_t *)0x0;
  do {
    local_130._slice._start._0_4_ = CONCAT31(local_130._slice._start._1_3_,0xc);
    local_130._slice._start._4_4_ = 4;
    pAVar2 = &local_130;
    local_130._current = puVar3;
    arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
              (&local_e0,(Value *)&local_130);
    puVar3 = puVar3 + 1;
  } while (puVar3 != (uint8_t *)0xa);
  arangodb::velocypack::Builder::close(&local_e0,(int)pAVar2);
  local_138._start = arangodb::velocypack::Builder::start(&local_e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Slice: ",7);
  poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,&local_138);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type: ",6);
  poVar1 = operator<<((ostream *)&std::cout,
                      arangodb::velocypack::SliceStaticData::TypeMap[*local_138._start]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bytesize: ",10);
  if ("\x01\x01"[*local_138._start] == '\0') {
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                    &local_138,local_138._start);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Members: ",9);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_138);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Iterating Array members:",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  arangodb::velocypack::ArrayIterator::ArrayIterator(&local_130,local_138);
  local_108._slice._start =
       (uint8_t *)CONCAT44(local_130._slice._start._4_4_,local_130._slice._start._0_4_);
  local_108._size = local_130._size;
  local_108._position = local_130._position;
  local_108._current = local_130._current;
  if (local_130._position != local_130._size) {
    do {
      local_110 = (uint8_t *)arangodb::velocypack::ArrayIterator::value(&local_108);
      poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,(Slice *)&local_110);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", number value: ",0x10);
      arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
      getUInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_110);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      arangodb::velocypack::ArrayIterator::next(&local_108);
    } while (local_108._position != local_108._size);
  }
  arangodb::velocypack::Builder::~Builder(&local_e0);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an array with 10 number members
  VPackBuilder b;

  b(VPackValue(VPackValueType::Array));
  for (size_t i = 0; i < 10; ++i) {
    b.add(VPackValue(i));
  }
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  VPackSlice s(b.start());

  // inspect the outermost value (should be an Array...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  // now iterate over the array members
  std::cout << "Iterating Array members:" << std::endl;
  for (auto const& it : VPackArrayIterator(s)) {
    std::cout << it << ", number value: " << it.getUInt() << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}